

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_xpubkey_Test::TestBody(Descriptor_Parse_Taproot_xpubkey_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  reference this_00;
  char *pcVar3;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1078;
  AssertHelper local_1030;
  Message local_1028;
  string local_1020;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_7;
  Message local_fe8;
  string local_fe0;
  undefined1 local_fc0 [8];
  AssertionResult gtest_ar_6;
  Message local_fa8;
  undefined1 local_fa0 [8];
  AssertionResult gtest_ar_5;
  Message local_f88;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_f80;
  SchnorrPubkey local_f68;
  AssertHelper local_f50;
  Message local_f48;
  Address local_f40;
  string local_dc8;
  undefined1 local_da8 [8];
  AssertionResult gtest_ar_4;
  Message local_d90;
  HashType local_d88 [2];
  undefined1 local_d80 [8];
  AssertionResult gtest_ar_3;
  Message local_d68;
  AddressType local_d60 [2];
  undefined1 local_d58 [8];
  AssertionResult gtest_ar_2;
  Message local_d40;
  string local_d38;
  AssertHelper local_d18;
  Message local_d10;
  Script local_d08;
  string local_cd0;
  AssertHelper local_cb0;
  Message local_ca8;
  bool local_c99;
  undefined1 local_c98 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_c68;
  Message local_c60;
  bool local_c51;
  undefined1 local_c50 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_c20;
  Message local_c18;
  bool local_c09;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_bd8;
  Message local_bd0;
  bool local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar__2;
  Message local_ba8;
  uint32_t local_ba0 [2];
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b68;
  Message local_b60;
  bool local_b51;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b20;
  Message local_b18;
  bool local_b09;
  undefined1 local_b08 [8];
  AssertionResult gtest_ar_;
  Message local_af0 [2];
  DescriptorScriptReference local_ae0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78b;
  undefined1 local_78a;
  allocator local_789;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  iterator local_760;
  size_type local_758;
  undefined1 local_750 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_nums;
  AssertionResult gtest_ar;
  CfdException *except;
  NetType local_5a4;
  undefined1 local_5a0 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  DescriptorScriptReference script_ref;
  string local_230 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  string local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Taproot_xpubkey_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,
             "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*)"
             ,(allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_5a0);
  local_5a4 = kMainnet;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  local_78a = 1;
  local_788 = &local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"1",&local_789);
  local_78a = 0;
  local_760 = &local_780;
  local_758 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_78b);
  __l._M_len = local_758;
  __l._M_array = local_760;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_750,__l,&local_78b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_78b);
  local_1078 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_760;
  do {
    local_1078 = local_1078 + -1;
    std::__cxx11::string::~string((string *)local_1078);
  } while (local_1078 != &local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_ae0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_750);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_ae0);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_ae0);
    }
  }
  else {
    testing::Message::Message(local_af0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x439,
               "Expected: script_ref = desc.GetReference(&child_nums) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_af0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_af0);
  }
  local_b09 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b08,&local_b09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
  if (!bVar1) {
    testing::Message::Message(&local_b18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b08,
               (AssertionResult *)"script_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b20,&local_b18);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
  local_b51 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b50,&local_b51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b50,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
    testing::internal::AssertHelper::~AssertHelper(&local_b68);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  local_ba0[1] = 1;
  local_ba0[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_b98,"1","script_ref.GetKeyNum()",(int *)(local_ba0 + 1),
             local_ba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_bc1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bc0,&local_bc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_bc0,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_c09 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c08,&local_c09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_c08,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c08);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_c51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c50,&local_c51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_c60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_c50,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c68,&local_c60);
    testing::internal::AssertHelper::~AssertHelper(&local_c68);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_c60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c50);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_c99 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c98,&local_c99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c98);
  if (!bVar1) {
    testing::Message::Message(&local_ca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cd0,(internal *)local_c98,(AssertionResult *)"script_ref.HasScriptTree()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x440,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cb0,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper(&local_cb0);
    std::__cxx11::string::~string((string *)&local_cd0);
    testing::Message::~Message(&local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_d08,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_750);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_d08);
      cfd::core::Script::~Script(&local_d08);
    }
  }
  else {
    testing::Message::Message(&local_d10);
    testing::internal::AssertHelper::AssertHelper
              (&local_d18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x441,
               "Expected: locking_script = desc.GetLockingScript(child_nums) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d18,&local_d10);
    testing::internal::AssertHelper::~AssertHelper(&local_d18);
    testing::Message::~Message(&local_d10);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_d38,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_230,(string *)&local_d38);
      std::__cxx11::string::~string((string *)&local_d38);
    }
  }
  else {
    testing::Message::Message(&local_d40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x442,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d40);
  }
  local_d60[1] = 7;
  local_d60[0] = cfd::core::DescriptorScriptReference::GetAddressType
                           ((DescriptorScriptReference *)
                            &pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_d58,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_d60 + 1,local_d60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d58);
  if (!bVar1) {
    testing::Message::Message(&local_d68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x443,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d58);
  local_d88[1] = 6;
  local_d88[0] = cfd::core::DescriptorScriptReference::GetHashType
                           ((DescriptorScriptReference *)
                            &pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_d80,"HashType::kTaproot","script_ref.GetHashType()",
             local_d88 + 1,local_d88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d80);
  if (!bVar1) {
    testing::Message::Message(&local_d90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x444,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d80);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_f40,
             (DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_5a4);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_dc8,&local_f40);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_da8,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj\"",pcVar2,
             "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj");
  std::__cxx11::string::~string((string *)&local_dc8);
  cfd::core::Address::~Address(&local_f40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da8);
  if (!bVar1) {
    testing::Message::Message(&local_f48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_da8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x446,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f50,&local_f48);
    testing::internal::AssertHelper::~AssertHelper(&local_f50);
    testing::Message::~Message(&local_f48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_f80,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_f80,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_f68,this_00);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_5a0,&local_f68);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_f68);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_f80);
    }
  }
  else {
    testing::Message::Message(&local_f88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x447,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_f88);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_fa0,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fa0);
  if (!bVar1) {
    testing::Message::Message(&local_fa8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x448,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fa0);
  cfd::core::Script::ToString_abi_cxx11_(&local_fe0,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_fc0,"locking_script.ToString().c_str()",
             "\"1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48\"",pcVar2,
             "1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48");
  std::__cxx11::string::~string((string *)&local_fe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fc0);
  if (!bVar1) {
    testing::Message::Message(&local_fe8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x44a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_fe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fc0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1020,(SchnorrPubkey *)local_5a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1000,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_1020);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
  if (!bVar1) {
    testing::Message::Message(&local_1028);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1000);
    testing::internal::AssertHelper::AssertHelper
              (&local_1030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,1099,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1030,&local_1028);
    testing::internal::AssertHelper::~AssertHelper(&local_1030);
    testing::Message::~Message(&local_1028);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_750);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_5a0);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_230);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_xpubkey) {
  std::string pubkey_hex = "8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816";
  std::string descriptor1 = "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kMainnet;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> child_nums = {"1"};

  EXPECT_NO_THROW(script_ref = desc.GetReference(&child_nums));
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript(child_nums));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48");
  EXPECT_STREQ(pubkey.GetHex().c_str(), pubkey_hex.c_str());
}